

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp2.c
# Opt level: O0

ReturnCode doif(Global *global,int hash)

{
  int iVar1;
  ReturnCode RVar2;
  DEFBUF *pDVar3;
  int in_ESI;
  Global *in_RDI;
  bool bVar4;
  int unaff_retaddr;
  ReturnCode ret;
  int found;
  int c;
  int *in_stack_00000390;
  Global *in_stack_00000398;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_14;
  
  iVar1 = skipws((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((iVar1 == 10) || (iVar1 == 0)) {
    unget((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    cerror(in_RDI,ERROR_MISSING_ARGUMENT);
    skipnl((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    unget((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    if (in_ESI == 0x69) {
      unget((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      RVar2 = eval(in_stack_00000398,in_stack_00000390);
      if (RVar2 != FPP_OK) {
        return RVar2;
      }
      bVar4 = in_stack_ffffffffffffffe4 != 0;
      local_14 = 0x131;
    }
    else {
      if (type[iVar1] != '\x02') {
        cerror(in_RDI,ERROR_MISSING_ARGUMENT);
        skipnl((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        unget((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        return FPP_OK;
      }
      pDVar3 = lookid(_ret,unaff_retaddr);
      bVar4 = pDVar3 != (DEFBUF *)0x0;
      local_14 = in_ESI;
    }
    if (bVar4 == (local_14 == 0x131)) {
      in_RDI->ifstack[0] = '\x01';
      *in_RDI->ifptr = *in_RDI->ifptr | 4;
    }
    else {
      in_RDI->ifstack[0] = '\0';
    }
  }
  return FPP_OK;
}

Assistant:

FILE_LOCAL
ReturnCode doif(struct Global *global, int hash)
{
    /*
     * Process an #if, #ifdef, or #ifndef. The latter two are straightforward,
     * while #if needs a subroutine of its own to evaluate the expression.
     *
     * doif() is called only if compiling is TRUE.  If false, compilation
     * is always supressed, so we don't need to evaluate anything.  This
     * supresses unnecessary warnings.
     */

    int c;
    int found;
    ReturnCode ret;

    if( (c = skipws( global ) ) == '\n' || c == EOF_CHAR )
        {
        unget( global );

        cerror( global, ERROR_MISSING_ARGUMENT );

        #if !OLD_PREPROCESSOR
        skipnl( global );               /* Prevent an extra     */

        unget( global );                /* Error message        */
        #endif

        return(FPP_OK);
        }

    if( hash == L_if )
        {
        unget( global );

        ret = eval( global, &found );

        if( ret )
            return( ret );

        found = (found != 0);     /* Evaluate expr, != 0 is  TRUE */

        hash = L_ifdef;       /* #if is now like #ifdef */
        }
    else
        {
        if( type[c] != LET )
            {         /* Next non-blank isn't letter  */
                          /* ... is an error          */
            cerror( global, ERROR_MISSING_ARGUMENT );

            #if !OLD_PREPROCESSOR
            skipnl( global );             /* Prevent an extra     */

            unget( global );              /* Error message        */
            #endif

            return(FPP_OK);
            }

        found = ( lookid( global, c ) != NULL ); /* Look for it in symbol table */
        }

    if( found == (hash == L_ifdef) )
        {
        compiling = TRUE;

        *global->ifptr |= TRUE_SEEN;
        }
    else
        compiling = FALSE;

    return(FPP_OK);
}